

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Int_t *
Gia_RsbSetFind(word *pOffSet,word *pOnSet,Vec_Wrd_t *vSims,int nWords,Vec_Wrd_t *vSimsT,int nWordsT,
              Vec_Int_t *vCands)

{
  Gia_RsbMan_t *p;
  Vec_Int_t *p_00;
  int fReverse;
  
  p = Gia_RsbAlloc((Gia_Man_t *)0x0,pOffSet,pOnSet,vSims,nWords,vSimsT,nWordsT,vCands);
  fReverse = (int)pOffSet;
  p_00 = Gia_RsbSolve(p);
  Gia_RsbFree(p);
  Vec_IntSort(p_00,fReverse);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_RsbSetFind( word * pOffSet, word * pOnSet, Vec_Wrd_t * vSims, int nWords, Vec_Wrd_t * vSimsT, int nWordsT, Vec_Int_t * vCands )
{
    Gia_RsbMan_t * p  = Gia_RsbAlloc( NULL, pOffSet, pOnSet, vSims, nWords, vSimsT, nWordsT, vCands );
    Vec_Int_t * vObjs = Gia_RsbSolve( p );
    Gia_RsbFree( p );
    Vec_IntSort( vObjs, 0 );
    return vObjs;
}